

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdGetConfidentialTxIn
              (void *handle,char *tx_hex_string,uint32_t index,char **txid,uint32_t *vout,
              uint32_t *sequence,char **script_sig)

{
  bool bVar1;
  ConfidentialTransaction *this;
  char *pcVar2;
  char *pcVar3;
  CfdException *this_00;
  char *work_txid;
  string local_238;
  Script local_218;
  ConfidentialTransactionController ctxc;
  ConfidentialTxInReference ref;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&ref,tx_hex_string,(allocator *)&local_218);
    cfd::ConfidentialTransactionController::ConfidentialTransactionController(&ctxc,(string *)&ref);
    std::__cxx11::string::~string((string *)&ref);
    this = cfd::ConfidentialTransactionController::GetTransaction(&ctxc);
    cfd::core::ConfidentialTransaction::GetTxIn(&ref,this,index);
    if (txid == (char **)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      cfd::core::Txid::Txid((Txid *)&local_238,&ref.super_AbstractTxInReference.txid_);
      cfd::core::Txid::GetHex_abi_cxx11_((string *)&local_218,(Txid *)&local_238);
      pcVar2 = cfd::capi::CreateString((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      cfd::core::Txid::~Txid((Txid *)&local_238);
    }
    if (vout != (uint32_t *)0x0) {
      *vout = ref.super_AbstractTxInReference.vout_;
    }
    if (sequence != (uint32_t *)0x0) {
      *sequence = ref.super_AbstractTxInReference.sequence_;
    }
    if (script_sig == (char **)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      cfd::core::Script::Script(&local_218,&ref.super_AbstractTxInReference.unlocking_script_);
      cfd::core::Script::GetHex_abi_cxx11_(&local_238,&local_218);
      pcVar3 = cfd::capi::CreateString(&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      cfd::core::Script::~Script(&local_218);
    }
    if (pcVar2 != (char *)0x0) {
      *txid = pcVar2;
    }
    if (pcVar3 != (char *)0x0) {
      *script_sig = pcVar3;
    }
    cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&ref);
    cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&ctxc);
    return 0;
  }
  ref.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x4fbb12;
  ref.super_AbstractTxInReference.txid_._vptr_Txid._0_4_ = 0x1cc;
  ref.super_AbstractTxInReference.txid_.data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = "CfdGetConfidentialTxIn";
  cfd::core::logger::warn<>((CfdSourceLocation *)&ref,"tx is null or empty.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&ref,"Failed to parameter. tx is null or empty.",(allocator *)&ctxc);
  cfd::core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&ref);
  __cxa_throw(this_00,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialTxIn(
    void* handle, const char* tx_hex_string, uint32_t index, char** txid,
    uint32_t* vout, uint32_t* sequence, char** script_sig) {
  char* work_txid = nullptr;
  char* work_script_sig = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    ConfidentialTransactionController ctxc(tx_hex_string);
    const ConfidentialTransaction& tx = ctxc.GetTransaction();
    const ConfidentialTxInReference ref = tx.GetTxIn(index);

    if (txid != nullptr) {
      work_txid = CreateString(ref.GetTxid().GetHex());
    }
    if (vout != nullptr) {
      *vout = ref.GetVout();
    }
    if (sequence != nullptr) {
      *sequence = ref.GetSequence();
    }
    if (script_sig != nullptr) {
      work_script_sig = CreateString(ref.GetUnlockingScript().GetHex());
    }

    if (work_txid != nullptr) *txid = work_txid;
    if (work_script_sig != nullptr) *script_sig = work_script_sig;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(&work_txid, &work_script_sig);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(&work_txid, &work_script_sig);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(&work_txid, &work_script_sig);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}